

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O1

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::InternReadFile
          (OpenGEXImporter *this,string *filename,aiScene *pScene,IOSystem *pIOHandler)

{
  ulong __n;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Context *pCVar3;
  aiNode *this_00;
  runtime_error *this_01;
  vector<char,_std::allocator<char>_> buffer;
  OpenDDLParser myParser;
  vector<char,_std::allocator<char>_> local_88;
  undefined1 local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60 [3];
  IOStream *stream;
  
  local_70._0_8_ = local_70 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"rb","");
  iVar2 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(filename->_M_dataplus)._M_p,local_70._0_8_);
  stream = (IOStream *)CONCAT44(extraout_var,iVar2);
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_,(ulong)(local_60[0]._M_allocated_capacity + 1));
  }
  if (stream != (IOStream *)0x0) {
    local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (char *)0x0;
    local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    BaseImporter::TextFileToBuffer(stream,&local_88,FORBID_EMPTY);
    (*pIOHandler->_vptr_IOSystem[5])(pIOHandler,stream);
    ODDLParser::OpenDDLParser::OpenDDLParser((OpenDDLParser *)local_70);
    ODDLParser::OpenDDLParser::setBuffer
              ((OpenDDLParser *)local_70,
               local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
    bVar1 = ODDLParser::OpenDDLParser::parse((OpenDDLParser *)local_70);
    if (bVar1) {
      pCVar3 = ODDLParser::OpenDDLParser::getContext((OpenDDLParser *)local_70);
      this->m_ctx = pCVar3;
      this_00 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_00);
      pScene->mRootNode = this_00;
      __n = filename->_M_string_length;
      if (__n < 0x400) {
        (this_00->mName).length = (ai_uint32)__n;
        memcpy((this_00->mName).data,(filename->_M_dataplus)._M_p,__n);
        (this_00->mName).data[__n] = '\0';
      }
      handleNodes(this,this->m_ctx->m_root,pScene);
    }
    copyMeshes(this,pScene);
    copyCameras(this,pScene);
    copyLights(this,pScene);
    copyMaterials(this,pScene);
    resolveReferences(this);
    createNodeTree(this,pScene);
    ODDLParser::OpenDDLParser::~OpenDDLParser((OpenDDLParser *)local_70);
    if (local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 "Failed to open file ",filename);
  std::runtime_error::runtime_error(this_01,(string *)local_70);
  *(undefined ***)this_01 = &PTR__runtime_error_008e3168;
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OpenGEXImporter::InternReadFile( const std::string &filename, aiScene *pScene, IOSystem *pIOHandler ) {
    // open source file
    IOStream *file = pIOHandler->Open( filename, "rb" );
    if( !file ) {
        throw DeadlyImportError( "Failed to open file " + filename );
    }

    std::vector<char> buffer;
    TextFileToBuffer( file, buffer );
    pIOHandler->Close( file );

    OpenDDLParser myParser;
    myParser.setBuffer( &buffer[ 0 ], buffer.size() );
    bool success( myParser.parse() );
    if( success ) {
        m_ctx = myParser.getContext();
        pScene->mRootNode = new aiNode;
        pScene->mRootNode->mName.Set( filename );
        handleNodes( m_ctx->m_root, pScene );
    }

    copyMeshes( pScene );
    copyCameras( pScene );
    copyLights( pScene );
    copyMaterials( pScene );
    resolveReferences();
    createNodeTree( pScene );
}